

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O0

int jsonp_dtostr(char *buffer,size_t size,double value,int precision)

{
  int iVar1;
  char *pcVar2;
  ulong local_48;
  size_t length;
  char *end;
  char *start;
  int ret;
  int precision_local;
  double value_local;
  size_t size_local;
  char *buffer_local;
  
  start._4_4_ = precision;
  if (precision == 0) {
    start._4_4_ = 0x11;
  }
  iVar1 = snprintf(buffer,size,"%.*g",value,(ulong)start._4_4_);
  if (iVar1 < 0) {
    buffer_local._4_4_ = -1;
  }
  else {
    local_48 = (ulong)iVar1;
    if (local_48 < size) {
      from_locale(buffer);
      pcVar2 = strchr(buffer,0x2e);
      if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(buffer,0x65), pcVar2 == (char *)0x0)) {
        if (size <= local_48 + 3) {
          return -1;
        }
        buffer[local_48] = '.';
        buffer[local_48 + 1] = '0';
        buffer[local_48 + 2] = '\0';
        local_48 = local_48 + 2;
      }
      pcVar2 = strchr(buffer,0x65);
      if (pcVar2 != (char *)0x0) {
        end = pcVar2 + 1;
        length = (size_t)(pcVar2 + 2);
        if (*end == '-') {
          end = pcVar2 + 2;
        }
        for (; *(char *)length == '0'; length = length + 1) {
        }
        if ((char *)length != end) {
          memmove(end,(void *)length,local_48 - (length - (long)buffer));
          local_48 = local_48 - (length - (long)end);
        }
      }
      buffer_local._4_4_ = (int)local_48;
    }
    else {
      buffer_local._4_4_ = -1;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int jsonp_dtostr(char *buffer, size_t size, double value, int precision) {
    int ret;
    char *start, *end;
    size_t length;

    if (precision == 0)
        precision = 17;

    ret = snprintf(buffer, size, "%.*g", precision, value);
    if (ret < 0)
        return -1;

    length = (size_t) ret;
    if (length >= size)
        return -1;

#if JSON_HAVE_LOCALECONV
    from_locale(buffer);
#endif

    /* Make sure there's a dot or 'e' in the output. Otherwise
       a real is converted to an integer when decoding */
    if (strchr(buffer, '.') == NULL && strchr(buffer, 'e') == NULL) {
        if (length + 3 >= size) {
            /* No space to append ".0" */
            return -1;
        }
        buffer[length] = '.';
        buffer[length + 1] = '0';
        buffer[length + 2] = '\0';
        length += 2;
    }

    /* Remove leading '+' from positive exponent. Also remove leading
       zeros from exponents (added by some printf() implementations) */
    start = strchr(buffer, 'e');
    if (start) {
        start++;
        end = start + 1;

        if (*start == '-')
            start++;

        while (*end == '0')
            end++;

        if (end != start) {
            memmove(start, end, length - (size_t) (end - buffer));
            length -= (size_t) (end - start);
        }
    }

    return (int) length;
}